

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O2

void cali::util::
     tokenize<std::__cxx11::string,char,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input,
               char *tokens,
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               out)

{
  char cVar1;
  char *tc;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  value_type local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pcVar4 = (input->_M_dataplus)._M_p;
  pcVar5 = pcVar4 + input->_M_string_length;
  do {
    if (pcVar4 == pcVar5) {
      if (local_50._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(out.container,&local_50);
      }
      std::__cxx11::string::~string((string *)&local_50);
      return;
    }
    pcVar2 = tokens;
    do {
      cVar1 = *pcVar2;
      cVar3 = (char)&local_50;
      if (cVar1 == '\0') {
        std::__cxx11::string::push_back(cVar3);
        goto LAB_001bd4b3;
      }
      pcVar2 = pcVar2 + 1;
    } while (*pcVar4 != cVar1);
    if (local_50._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(out.container,&local_50);
    }
    local_50._M_string_length = 0;
    *local_50._M_dataplus._M_p = '\0';
    std::__cxx11::string::push_back(cVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(out.container,&local_50);
    local_50._M_string_length = 0;
    *local_50._M_dataplus._M_p = '\0';
LAB_001bd4b3:
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

void tokenize(String input, const Char* tokens, OutputIterator out)
{
    String str;

    for (Char c : input) {
        bool is_token_char = false;
        for (const Char* tc = tokens; *tc; ++tc)
            if (c == *tc) {
                is_token_char = true;
                break;
            }

        if (is_token_char) {
            if (!str.empty())
                *out++ = str;
            str.clear();

            str.push_back(c);
            *out++ = str;
            str.clear();
        } else {
            str.push_back(c);
        }
    }

    if (!str.empty())
        *out++ = str;
}